

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O3

int CfdGetLastErrorMessage(void *handle,char **message)

{
  char *pcVar1;
  int iVar2;
  string err_str;
  CfdException last_error;
  allocator local_79;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  CfdException local_58;
  
  if (message == (char **)0x0) {
    iVar2 = 1;
  }
  else {
    cfd::capi::CfdCapiManager::GetLastError(&local_58,(CfdCapiManager *)message,handle);
    std::__cxx11::string::string((string *)&local_78,local_58.message_._M_dataplus._M_p,&local_79);
    pcVar1 = (char *)malloc(local_70 + 1U);
    if (pcVar1 == (char *)0x0) {
      iVar2 = 2;
    }
    else {
      iVar2 = 0;
      std::__cxx11::string::copy((char *)&local_78,(ulong)pcVar1,local_70 + 1U);
      pcVar1[local_70] = '\0';
      *message = pcVar1;
    }
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
    cfd::core::CfdException::~CfdException(&local_58);
  }
  return iVar2;
}

Assistant:

int CfdGetLastErrorMessage(void* handle, char** message) {
  try {
    if (message == nullptr) return kCfdIllegalArgumentError;
    CfdException last_error = cfd::capi::capi_instance.GetLastError(handle);
    std::string err_str(last_error.what());
    size_t len = err_str.length() + 1;
    char* buffer = static_cast<char*>(malloc(len));
    if (buffer == nullptr) return kCfdIllegalStateError;
    err_str.copy(buffer, len);
    buffer[len - 1] = '\0';
    *message = buffer;
    return kCfdSuccess;
  } catch (const CfdException& except) {
    return except.GetErrorCode();
  } catch (...) {
    return kCfdUnknownError;
  }
}